

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::JumpThreader::redirectBranches(wasm::
Block*,wasm::Name_(void *this,Block *from,Name to)

{
  pointer ppEVar1;
  bool bVar2;
  mapped_type *pmVar3;
  pointer ppEVar4;
  char *in_R9;
  Name from_00;
  Name to_00;
  undefined1 local_60 [8];
  Name to_local;
  Expression *branch;
  
  local_60 = (undefined1  [8])to.super_IString.str._M_len;
  to_local.super_IString.str._M_len = (size_t)to.super_IString.str._M_str;
  pmVar3 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)((long)this + 0xd8),&from->name);
  ppEVar1 = (pmVar3->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar4 = (pmVar3->
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar1; ppEVar4 = ppEVar4 + 1
      ) {
    from_00.super_IString.str._M_str = to.super_IString.str._M_len;
    from_00.super_IString.str._M_len = (size_t)(from->name).super_IString.str._M_str;
    to_00.super_IString.str._M_str = in_R9;
    to_00.super_IString.str._M_len = (size_t)to.super_IString.str._M_str;
    bVar2 = BranchUtils::replacePossibleTarget
                      ((BranchUtils *)*ppEVar4,(Expression *)(from->name).super_IString.str._M_len,
                       from_00,to_00);
    if (bVar2) {
      *(undefined1 *)((long)this + 0x110) = 1;
    }
  }
  ppEVar1 = (pmVar3->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar4 = (pmVar3->
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar1; ppEVar4 = ppEVar4 + 1
      ) {
    to_local.super_IString.str._M_str = (char *)*ppEVar4;
    pmVar3 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)((long)this + 0xd8),(key_type *)local_60);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pmVar3,(value_type *)&to_local.super_IString.str._M_str);
  }
  return;
}

Assistant:

void redirectBranches(Block* from, Name to) {
        auto& branches = labelToBranches[from->name];
        for (auto* branch : branches) {
          if (BranchUtils::replacePossibleTarget(branch, from->name, to)) {
            worked = true;
          }
        }
        // if the jump is to another block then we can update the list, and
        // maybe push it even more later
        for (auto* branch : branches) {
          labelToBranches[to].push_back(branch);
        }
      }